

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall
test_matrix_sparse_operator_subscript_Test::TestBody
          (test_matrix_sparse_operator_subscript_Test *this)

{
  initializer_list<double> value;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  bool bVar4;
  char cVar5;
  int iVar6;
  Scalar *pSVar7;
  char *pcVar8;
  long lVar9;
  StringLike<const_char_*> *regex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var10;
  _func_int **pp_Var11;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix_1;
  Matrix_Sparse matrix_0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_138;
  undefined1 local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  pointer local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f0;
  pointer local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  size_t local_b0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *local_a0;
  undefined8 uStack_98;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  Matrix_Sparse local_78;
  
  local_f8 = (undefined1  [8])0x0;
  pbStack_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_e8 = (pointer)0x2;
  _local_120 = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(ZEXT816(1) << 0x40);
  local_a0 = &local_138;
  local_138.matrix = (Matrix_Sparse *)0x3ff0000000000000;
  local_138.row_index = 0x4000000000000000;
  uStack_98 = 2;
  value._M_len = 2;
  value._M_array = (iterator)local_a0;
  non_zero._M_len = 3;
  non_zero._M_array = (iterator)local_f8;
  index._M_len = 2;
  index._M_array = (iterator)local_120;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_78,non_zero,index,value,2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_138.row_index;
  local_138 = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(auVar1 << 0x40);
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_120,(size_t *)&local_78);
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_120,(size_t *)&local_140);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f8,"matrix_0[0][0]","1.0",*pSVar7,1.0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_120);
    if (pbStack_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x62,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_120 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(unsigned_long *)local_120 + 8))();
    }
  }
  if (pbStack_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f0,pbStack_f0);
  }
  local_138.matrix = (Matrix_Sparse *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_120,(size_t *)&local_78);
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_120,(size_t *)&local_140);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f8,"matrix_0[1][1]","2.0",*pSVar7,2.0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_120);
    if (pbStack_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,99,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_120 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(unsigned_long *)local_120 + 8))();
    }
  }
  if (pbStack_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f0,pbStack_f0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_118._M_pi;
  _local_120 = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(auVar2 << 0x40);
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_78);
  local_138.matrix = (Matrix_Sparse *)0x1;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_f8,(size_t *)&local_138);
  *pSVar7 = (Scalar)&DAT_4008000000000000;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,
             &local_78.row_non_zero);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e0,&local_78.column_index);
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,&local_78.element_value);
  local_b0 = local_78.column_size;
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_140);
  local_100 = (pointer)0x0;
  pSVar7 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     (&local_138,(size_t *)&local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"matrix_1[0][0]","1.0",*pSVar7,1.0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var11 = (_func_int **)0x16e854;
    }
    else {
      pp_Var11 = (local_118._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x67,(char *)pp_Var11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if (local_138.matrix != (Matrix_Sparse *)0x0) {
      (*(code *)((local_138.matrix)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._M_pi);
  }
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_140);
  local_100 = (pointer)0x1;
  pSVar7 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     (&local_138,(size_t *)&local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"matrix_1[0][1]","3.0",*pSVar7,3.0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var11 = (_func_int **)0x16e854;
    }
    else {
      pp_Var11 = (local_118._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x68,(char *)pp_Var11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if (local_138.matrix != (Matrix_Sparse *)0x0) {
      (*(code *)((local_138.matrix)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._M_pi);
  }
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_138 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_140);
  local_100 = (pointer)0x1;
  pSVar7 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     (&local_138,(size_t *)&local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"matrix_1[1][1]","2.0",*pSVar7,2.0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var11 = (_func_int **)0x16e854;
    }
    else {
      pp_Var11 = (local_118._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x69,(char *)pp_Var11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if (local_138.matrix != (Matrix_Sparse *)0x0) {
      (*(code *)((local_138.matrix)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._M_pi);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_138.matrix = (Matrix_Sparse *)"./*";
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_120,
               (testing *)&local_138,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_90,(PolymorphicMatcher *)local_120);
    if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("matrix_1[1][0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x6c,(DeathTest **)&local_140);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    _Var10._M_head_impl = local_140._M_head_impl;
    if (!bVar4) goto LAB_00112914;
    if ((Matrix_Sparse *)local_140._M_head_impl == (Matrix_Sparse *)0x0) goto LAB_0011296a;
    iVar6 = (**(code **)(*(long *)local_140._M_head_impl + 0x10))(local_140._M_head_impl);
    _Var3._M_head_impl = local_140._M_head_impl;
    if (iVar6 == 0) {
      iVar6 = (**(code **)(*(long *)local_140._M_head_impl + 0x18))(local_140._M_head_impl);
      bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
      cVar5 = (**(code **)(*(long *)_Var3._M_head_impl + 0x20))(_Var3._M_head_impl,bVar4);
      if (cVar5 == '\0') {
        (**(code **)(*(long *)_Var10._M_head_impl + 8))(_Var10._M_head_impl);
        goto LAB_00112914;
      }
    }
    else if (iVar6 == 1) {
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        local_138.matrix = (Matrix_Sparse *)0x1;
        _local_120 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_138)
        ;
        local_100 = (pointer)0x0;
        Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                  ((Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_120,(size_t *)&local_100);
      }
      (**(code **)(*(long *)local_140._M_head_impl + 0x28))(local_140._M_head_impl,2);
      (**(code **)(*(long *)_Var3._M_head_impl + 0x28))(_Var3._M_head_impl,0);
    }
    lVar9 = *(long *)_Var10._M_head_impl;
  }
  else {
LAB_00112914:
    testing::Message::Message((Message *)local_120);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x6c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_120 ==
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) goto LAB_0011296a;
    lVar9 = *(long *)local_120;
    _Var10._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  }
  (**(code **)(lVar9 + 8))(_Var10._M_head_impl);
LAB_0011296a:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_f8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_78);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_subscript) {
  Matrix_Sparse matrix_0({0, 1, 2}, {0, 1}, {1.0, 2.0}, 2);

  EXPECT_DOUBLE_EQ(matrix_0[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][1], 2.0);
  matrix_0[0][1] = 3.0;  // this should insert a new element.

  const Matrix_Sparse matrix_1 = matrix_0;
  EXPECT_DOUBLE_EQ(matrix_1[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_1[0][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix_1[1][1], 2.0);

  // Check debug for const matrix.
  EXPECT_DEATH(matrix_1[1][0], "./*");
}